

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O0

Lazy<void>
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::reconnect
          (unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
           *client,weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                   *watcher)

{
  uint uVar1;
  bool bVar2;
  undefined8 *puVar3;
  LazyPromise<void> *this;
  null_logger_t *pnVar4;
  pointer pcVar5;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *e;
  element_type *peVar6;
  undefined8 *extraout_RAX;
  type_conflict3 *ptVar7;
  type *ptVar8;
  type tVar9;
  milliseconds mVar10;
  type_conflict tVar11;
  rep rVar12;
  undefined8 *extraout_RAX_00;
  config *this_00;
  undefined8 *extraout_RAX_01;
  uint *puVar13;
  undefined8 in_RSI;
  LazyBase<void,_false> in_RDI;
  string_view sVar14;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> pVar15;
  shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
  *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  LazyPromise<void> *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  size_t local_4b0;
  char *local_4a8;
  size_t local_488;
  char *local_480;
  int local_464;
  int local_3d8;
  size_t local_368;
  char *local_360;
  size_t local_340;
  char *local_338;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  basic_string_view<char,_std::char_traits<char>_> *self;
  unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_> *client_00;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  pointer local_180 [11];
  rep local_128;
  weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
  *in_stack_fffffffffffffee0;
  config *in_stack_fffffffffffffee8;
  
  puVar3 = (undefined8 *)operator_new(0x160,(nothrow_t *)&std::nothrow);
  if (puVar3 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<void>::get_return_object_on_allocation_failure();
    return (LazyBase<void,_false>)in_RDI._coro.__handle_;
  }
  *puVar3 = reconnect;
  puVar3[1] = reconnect;
  puVar13 = (uint *)(puVar3 + 0x2a);
  self = (basic_string_view<char,_std::char_traits<char>_> *)(puVar3 + 0xe);
  client_00 = (unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
               *)(puVar3 + 0x2b);
  this = (LazyPromise<void> *)(puVar3 + 2);
  puVar3[0x1a] = in_RSI;
  std::weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
  weak_ptr((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *)
           CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
           (weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *)
           in_stack_fffffffffffffb08);
  async_simple::coro::detail::LazyPromise<void>::LazyPromise
            ((LazyPromise<void> *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  async_simple::coro::detail::LazyPromise<void>::get_return_object(in_stack_fffffffffffffb28);
  async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)this);
  bVar2 = std::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x15d));
  if (!bVar2) {
    *(undefined1 *)((long)puVar3 + 0x15c) = 0;
    coro_io::client_pool
              ((void *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               (void *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    return (LazyBase<void,_false>)in_RDI._coro.__handle_;
  }
  std::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x15d));
  std::weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::lock
            ((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *
             )CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  *puVar13 = 0xffffffff;
  do {
    pnVar4 = cinatra::null_logger_t::operator<<
                       ((null_logger_t *)&cinatra::NULL_LOGGER,
                        (char (*) [25])"try to reconnect client{");
    pcVar5 = std::
             unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
             ::get((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                    *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    puVar3[0x1b] = pcVar5;
    e = (ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *)
        cinatra::null_logger_t::operator<<(pnVar4,(coro_http_client **)(puVar3 + 0x1b));
    pnVar4 = cinatra::null_logger_t::operator<<((null_logger_t *)e,(char (*) [9])"},host:{");
    std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
    operator->((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                *)0x45547a);
    sVar14 = cinatra::coro_http_client::get_host((coro_http_client *)0x455482);
    local_338 = sVar14._M_str;
    local_340 = sVar14._M_len;
    ((basic_string_view<char,_std::char_traits<char>_> *)(puVar3 + 0xc))->_M_len = local_340;
    puVar3[0xd] = local_338;
    pnVar4 = cinatra::null_logger_t::operator<<
                       (pnVar4,(basic_string_view<char,_std::char_traits<char>_> *)(puVar3 + 0xc));
    pnVar4 = cinatra::null_logger_t::operator<<(pnVar4,(char (*) [2])0x79ca7e);
    std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
    operator->((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                *)0x4554f2);
    sVar14 = cinatra::coro_http_client::get_port((coro_http_client *)0x4554fa);
    local_360 = sVar14._M_str;
    local_368 = sVar14._M_len;
    self->_M_len = local_368;
    self->_M_str = local_360;
    pnVar4 = cinatra::null_logger_t::operator<<(pnVar4,self);
    pnVar4 = cinatra::null_logger_t::operator<<(pnVar4,(char (*) [14])"}, try count:");
    *(uint *)&(client_00->_M_t).
              super___uniq_ptr_impl<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
              ._M_t.
              super__Tuple_impl<0UL,_cinatra::coro_http_client_*,_std::default_delete<cinatra::coro_http_client>_>
              .super__Head_base<0UL,_cinatra::coro_http_client_*,_false>._M_head_impl = *puVar13 + 1
    ;
    pnVar4 = cinatra::null_logger_t::operator<<(pnVar4,(uint *)client_00);
    pnVar4 = cinatra::null_logger_t::operator<<(pnVar4,(char (*) [17])"max retry limit:");
    peVar6 = std::
             __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4555a2);
    cinatra::null_logger_t::operator<<(pnVar4,&(peVar6->pool_config_).connect_retry_count);
    reconnect_impl(client_00,
                   (shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                    *)self);
    async_simple::coro::detail::LazyPromiseBase::
    await_transform<async_simple::coro::Lazy<std::pair<bool,std::chrono::duration<long,std::ratio<1l,1000l>>>>>
              ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (Lazy<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_> *)
               CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    bVar2 = async_simple::coro::detail::
            LazyAwaiterBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
            ::await_ready((LazyAwaiterBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                           *)(puVar3 + 0x1d));
    if (!bVar2) {
      *(undefined1 *)((long)puVar3 + 0x15c) = 1;
      coro_io::client_pool
                ((void *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 in_stack_fffffffffffffb28);
      (*(code *)*extraout_RAX)(extraout_RAX);
      return (LazyBase<void,_false>)in_RDI._coro.__handle_;
    }
    puVar3[0x18] = (LazyAwaiterBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                    *)(puVar3 + 0x1d);
    pVar15 = async_simple::coro::detail::
             LazyAwaiterBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
             ::awaitResume((LazyAwaiterBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                            *)in_stack_fffffffffffffb28);
    *(bool *)(puVar3 + 6) = pVar15.first;
    puVar3[7] = pVar15.second.__r.__r;
    *(undefined1 *)(puVar3 + 0x10) = *(undefined1 *)(puVar3 + 6);
    puVar3[0x11] = puVar3[7];
    async_simple::coro::detail::
    LazyBase<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_false>::
    ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x4557a5);
    async_simple::coro::Lazy<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
    ::~Lazy((Lazy<std::pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_> *)0x4557b2
           );
    ptVar7 = std::get<0ul,bool,std::chrono::duration<long,std::ratio<1l,1000l>>>
                       ((pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)0x4557e5
                       );
    puVar3[0x1f] = ptVar7;
    ptVar8 = std::get<1ul,bool,std::chrono::duration<long,std::ratio<1l,1000l>>>
                       ((pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *)0x455800
                       );
    puVar3[0x20] = ptVar8;
    if ((*(byte *)puVar3[0x1f] & 1) == 0) {
      pnVar4 = cinatra::null_logger_t::operator<<
                         ((null_logger_t *)&cinatra::NULL_LOGGER,(char (*) [18])0x78f322);
      pcVar5 = std::
               unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
               ::get((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                      *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
      puVar3[0x22] = pcVar5;
      pnVar4 = cinatra::null_logger_t::operator<<(pnVar4,(coro_http_client **)(puVar3 + 0x22));
      pnVar4 = cinatra::null_logger_t::operator<<
                         (pnVar4,(char (*) [28])"} failed. If client close:{");
      std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
      operator->((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                  *)0x455936);
      bVar2 = cinatra::coro_http_client::has_closed((coro_http_client *)0x45593e);
      *(bool *)((long)puVar3 + 0x15e) = bVar2;
      pnVar4 = cinatra::null_logger_t::operator<<(pnVar4,(bool *)((long)puVar3 + 0x15e));
      cinatra::null_logger_t::operator<<(pnVar4,(char (*) [2])0x796d0b);
      std::
      __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x455980);
      tVar9 = std::chrono::operator-
                        ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffb28,
                         (duration<long,_std::ratio<1L,_1000L>_> *)
                         CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      puVar3[0x25] = tVar9.__r;
      mVar10 = ms<(char)49>();
      puVar3[0x26] = mVar10.__r;
      tVar11 = std::chrono::operator/
                         ((duration<long,_std::ratio<1L,_1000L>_> *)
                          CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                          (duration<long,_std::ratio<1L,_1000L>_> *)
                          CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      puVar3[0x24] = tVar11;
      mVar10 = ms<(char)49>();
      puVar3[0x27] = mVar10.__r;
      local_128 = (rep)std::chrono::operator*
                                 ((long *)in_stack_fffffffffffffb08,
                                  (duration<long,_std::ratio<1L,_1000L>_> *)0x455a30);
      mVar10.__r._4_4_ = in_stack_fffffffffffffb1c;
      mVar10.__r._0_4_ = in_stack_fffffffffffffb18;
      mVar10 = rand_time(mVar10);
      ((duration<long,_std::ratio<1L,_1000L>_> *)(puVar3 + 0x23))->__r = mVar10.__r;
      std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
      shared_ptr((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                  *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                 in_stack_fffffffffffffb08);
      std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
      operator=((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                 *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                in_stack_fffffffffffffb08);
      std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
      ~shared_ptr((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                   *)0x455aa7);
      rVar12 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                         ((duration<long,_std::ratio<1L,_1000L>_> *)(puVar3 + 0x23));
      if (0 < rVar12) {
        pcVar5 = std::
                 unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                 ::operator->((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                               *)0x455ace);
        cinatra::coro_http_client::get_executor(pcVar5);
        sleep_for<std::chrono::duration<long,std::ratio<1l,1000l>>,coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)
                   CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),e);
        async_simple::coro::detail::LazyPromiseBase::await_transform<async_simple::coro::Lazy<void>>
                  ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                   (Lazy<void> *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
        bVar2 = async_simple::coro::detail::LazyAwaiterBase<void>::await_ready
                          ((LazyAwaiterBase<void> *)(puVar3 + 0x28));
        if (!bVar2) {
          *(undefined1 *)((long)puVar3 + 0x15c) = 2;
          coro_io::client_pool
                    ((void *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                     in_stack_fffffffffffffb28);
          (*(code *)*extraout_RAX_00)(extraout_RAX_00);
          return (LazyBase<void,_false>)in_RDI._coro.__handle_;
        }
        puVar3[0x19] = (LazyAwaiterBase<void> *)(puVar3 + 0x28);
        async_simple::coro::detail::LazyAwaiterBase<void>::awaitResume
                  ((LazyAwaiterBase<void> *)
                   CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
        async_simple::coro::detail::LazyBase<void,_false>::ValueAwaiter::~ValueAwaiter
                  ((ValueAwaiter *)0x455cc5);
        async_simple::coro::Lazy<void>::~Lazy((Lazy<void> *)0x455cd2);
      }
      std::weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
      lock((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *)
           CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
      operator=((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                 *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                in_stack_fffffffffffffb08);
      std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
      ~shared_ptr((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                   *)0x455d40);
      *puVar13 = *puVar13 + 1;
      local_3d8 = 0;
    }
    else {
      pnVar4 = cinatra::null_logger_t::operator<<
                         ((null_logger_t *)&cinatra::NULL_LOGGER,(char (*) [18])0x78f322);
      pcVar5 = std::
               unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
               ::get((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                      *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
      puVar3[0x21] = pcVar5;
      pnVar4 = cinatra::null_logger_t::operator<<(pnVar4,(coro_http_client **)(puVar3 + 0x21));
      cinatra::null_logger_t::operator<<(pnVar4,(char (*) [10])"} success");
      async_simple::coro::detail::LazyPromise<void>::return_void(this);
      local_3d8 = 3;
    }
    if (local_3d8 != 0) {
      local_464 = local_3d8;
      goto LAB_00455fd7;
    }
    uVar1 = *puVar13;
    peVar6 = std::
             __shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x455de4);
  } while (uVar1 < (peVar6->pool_config_).connect_retry_count);
  pnVar4 = cinatra::null_logger_t::operator<<
                     ((null_logger_t *)&cinatra::NULL_LOGGER,(char (*) [18])0x78f322);
  local_180[0] = std::
                 unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                 ::get((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                        *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  pnVar4 = cinatra::null_logger_t::operator<<(pnVar4,local_180);
  pnVar4 = cinatra::null_logger_t::operator<<(pnVar4,(char (*) [9])"},host:{");
  std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
  operator->((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
              *)0x455e76);
  sVar14 = cinatra::coro_http_client::get_host((coro_http_client *)0x455e7e);
  local_480 = sVar14._M_str;
  local_488 = sVar14._M_len;
  local_190._M_len = local_488;
  local_190._M_str = local_480;
  pnVar4 = cinatra::null_logger_t::operator<<(pnVar4,&local_190);
  pnVar4 = cinatra::null_logger_t::operator<<(pnVar4,(char (*) [2])0x79ca7e);
  std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
  operator->((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
              *)0x455edf);
  sVar14 = cinatra::coro_http_client::get_port((coro_http_client *)0x455ee7);
  local_4a8 = sVar14._M_str;
  local_4b0 = sVar14._M_len;
  local_1a0._M_len = local_4b0;
  local_1a0._M_str = local_4a8;
  pnVar4 = cinatra::null_logger_t::operator<<(pnVar4,&local_1a0);
  cinatra::null_logger_t::operator<<
            (pnVar4,(char (*) [47])"} out of max limit, stop retry. connect failed");
  pcVar5 = std::
           unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
           operator->((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                       *)0x455f43);
  this_00 = cinatra::coro_http_client::get_config(pcVar5);
  std::weak_ptr<coro_io::client_pool<cinatra::coro_http_client,coro_io::io_context_pool>>::
  weak_ptr<coro_io::client_pool<cinatra::coro_http_client,coro_io::io_context_pool>,void>
            ((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *
             )CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
             in_stack_fffffffffffffb08);
  alive_detect(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  async_simple::coro::detail::LazyBase<void,_false>::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_ylt_coro_io_client_pool_hpp:159:63)>
            ((LazyBase<void,_false> *)this_00,
             (type *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  async_simple::coro::Lazy<void>::~Lazy((Lazy<void> *)0x455fa5);
  std::weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
  ~weak_ptr((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *)
            0x455fb2);
  std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
  operator=((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
             *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
            in_stack_fffffffffffffb08);
  local_464 = 0;
LAB_00455fd7:
  std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
  ~shared_ptr((shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
               *)0x455fef);
  if (local_464 == 0) {
    async_simple::coro::detail::LazyPromise<void>::return_void(this);
  }
  else if (local_464 != 3) goto LAB_004561d0;
  async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)this);
  bVar2 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                    ((FinalAwaiter *)((long)puVar3 + 0x15f));
  if (!bVar2) {
    *puVar3 = 0;
    *(undefined1 *)((long)puVar3 + 0x15c) = 3;
    coro_io::client_pool
              ((void *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               (void *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    (*(code *)*extraout_RAX_01)(extraout_RAX_01);
    return (LazyBase<void,_false>)in_RDI._coro.__handle_;
  }
  async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
            ((FinalAwaiter *)((long)puVar3 + 0x15f));
LAB_004561d0:
  async_simple::coro::detail::LazyPromise<void>::~LazyPromise((LazyPromise<void> *)0x4561e8);
  std::weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
  ~weak_ptr((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_> *)
            0x4561f5);
  if (puVar3 != (undefined8 *)0x0) {
    operator_delete(puVar3,0x160);
  }
  return (Lazy<void>)in_RDI._coro.__handle_;
}

Assistant:

static async_simple::coro::Lazy<void> reconnect(
      std::unique_ptr<client_t>& client, std::weak_ptr<client_pool> watcher) {
    using namespace std::chrono_literals;
    std::shared_ptr<client_pool> self = watcher.lock();
    uint32_t i = UINT32_MAX;  // (at least connect once)
    do {
      CINATRA_LOG_TRACE << "try to reconnect client{" << client.get()
                        << "},host:{" << client->get_host() << ":"
                        << client->get_port() << "}, try count:" << i + 1
                        << "max retry limit:"
                        << self->pool_config_.connect_retry_count;
      auto [ok, cost_time] = co_await reconnect_impl(client, self);
      if (ok) {
        CINATRA_LOG_TRACE << "reconnect client{" << client.get() << "} success";
        co_return;
      }
      CINATRA_LOG_TRACE << "reconnect client{" << client.get()
                        << "} failed. If client close:{" << client->has_closed()
                        << "}";
      auto wait_time = rand_time(
          (self->pool_config_.reconnect_wait_time - cost_time) / 1ms * 1ms);
      self = nullptr;
      if (wait_time.count() > 0)
        co_await coro_io::sleep_for(wait_time, &client->get_executor());
      self = watcher.lock();
      ++i;
    } while (i < self->pool_config_.connect_retry_count);
    CINATRA_LOG_WARNING << "reconnect client{" << client.get() << "},host:{"
                        << client->get_host() << ":" << client->get_port()
                        << "} out of max limit, stop retry. connect failed";
    alive_detect(client->get_config(), std::move(self)).start([](auto&&) {
    });
    client = nullptr;
  }